

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnBlockExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  Expr *pEVar2;
  pointer *__ptr;
  _Head_base<0UL,_wabt::Expr_*,_false> local_28;
  
  pEVar2 = (Expr *)operator_new(0x188);
  (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar2->loc).filename._M_len = 0;
  (pEVar2->loc).filename._M_str = (char *)0x0;
  *(undefined8 *)((long)&(pEVar2->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar2->loc).field_1.field_1.offset + 4) = 0;
  pEVar2->type_ = Block;
  pEVar2->_vptr_Expr = (_func_int **)&PTR__BlockExprBase_0017a8d8;
  Block::Block((Block *)(pEVar2 + 1));
  SetBlockDeclaration(this,(BlockDeclaration *)&pEVar2[1].loc.filename._M_str,sig_type);
  local_28._M_head_impl = pEVar2;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_28);
  if (local_28._M_head_impl != (Expr *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar1.enum_ != Error) {
    PushLabel(this,Block,(ExprList *)&pEVar2[5].super_intrusive_list_base<wabt::Expr>.prev_,
              (Expr *)0x0);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnBlockExpr(Type sig_type) {
  auto expr = std::make_unique<BlockExpr>();
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::Block, expr_list);
  return Result::Ok;
}